

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O3

void bloaty::wasm::ReadDataSection(Section *section,IndexedNames *names,RangeSink *sink)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  uint64_t uVar4;
  const_iterator cVar5;
  long *plVar6;
  uint uVar7;
  long *plVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  size_type __rlen;
  size_t sVar12;
  ulong filesize;
  uint __val;
  string_view name_00;
  string_view name_01;
  string name;
  string __str;
  long *local_b8;
  size_t local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  string_view local_78;
  long *local_60;
  uint local_58;
  long local_50 [2];
  uint64_t local_40;
  _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_38;
  
  local_78._M_len = (section->contents)._M_len;
  local_78._M_str = (section->contents)._M_str;
  __val = 0;
  local_38 = &names->_M_h;
  local_40 = ReadLEB128Internal(false,0x20,&local_78);
  if ((int)local_40 != 0) {
    pcVar10 = local_78._M_str;
    sVar12 = local_78._M_len;
    do {
      uVar4 = ReadLEB128Internal(false,0x20,&local_78);
      if (1 < (uint)uVar4) {
        Throw("multi-memory extension isn\'t supported",0x16e);
      }
      if ((uint)uVar4 == 0) {
        SkipInitializerExpression(&local_78);
      }
      uVar4 = ReadLEB128Internal(false,0x20,&local_78);
      filesize = (ulong)(uint)(((int)uVar4 - (int)pcVar10) + (int)local_78._M_str);
      if (sVar12 < filesize) {
        Throw("region out-of-bounds",0x5d);
      }
      uVar9 = uVar4 & 0xffffffff;
      sVar12 = local_78._M_len - uVar9;
      if (local_78._M_len < uVar9) {
        Throw("region out-of-bounds",100);
      }
      pcVar11 = local_78._M_str + uVar9;
      local_b8 = (long *)CONCAT44(local_b8._4_4_,__val);
      local_78._M_len = sVar12;
      local_78._M_str = pcVar11;
      cVar5 = std::
              _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(local_38,(key_type_conflict *)&local_b8);
      if (cVar5.
          super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        cVar3 = '\x01';
        if (9 < __val) {
          uVar9 = (ulong)__val;
          cVar2 = '\x04';
          do {
            cVar3 = cVar2;
            uVar7 = (uint)uVar9;
            if (uVar7 < 100) {
              cVar3 = cVar3 + -2;
              goto LAB_001a1d0f;
            }
            if (uVar7 < 1000) {
              cVar3 = cVar3 + -1;
              goto LAB_001a1d0f;
            }
            if (uVar7 < 10000) goto LAB_001a1d0f;
            uVar9 = uVar9 / 10000;
            cVar2 = cVar3 + '\x04';
          } while (99999 < uVar7);
          cVar3 = cVar3 + '\x01';
        }
LAB_001a1d0f:
        local_60 = local_50;
        std::__cxx11::string::_M_construct((ulong)&local_60,cVar3);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_60,local_58,__val);
        plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x339d38);
        local_98 = &local_88;
        plVar8 = plVar6 + 2;
        if ((long *)*plVar6 == plVar8) {
          local_88 = *plVar8;
          lStack_80 = plVar6[3];
        }
        else {
          local_88 = *plVar8;
          local_98 = (long *)*plVar6;
        }
        local_90 = plVar6[1];
        *plVar6 = (long)plVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_98);
        local_b8 = &local_a8;
        plVar8 = plVar6 + 2;
        if ((long *)*plVar6 == plVar8) {
          local_a8 = *plVar8;
          lStack_a0 = plVar6[3];
        }
        else {
          local_a8 = *plVar8;
          local_b8 = (long *)*plVar6;
        }
        local_b0 = plVar6[1];
        *plVar6 = (long)plVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if (local_98 != &local_88) {
          operator_delete(local_98,local_88 + 1);
        }
        if (local_60 != local_50) {
          operator_delete(local_60,local_50[0] + 1);
        }
        pcVar1 = (sink->file_->data_)._M_str;
        if ((pcVar1 <= pcVar10) && (pcVar10 < pcVar1 + (sink->file_->data_)._M_len)) {
          name_01._M_str = (char *)local_b8;
          name_01._M_len = local_b0;
          RangeSink::AddFileRange(sink,"wasm_data",name_01,(long)pcVar10 - (long)pcVar1,filesize);
        }
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8 + 1);
        }
      }
      else {
        pcVar1 = (sink->file_->data_)._M_str;
        if ((pcVar1 <= pcVar10) && (pcVar10 < pcVar1 + (sink->file_->data_)._M_len)) {
          name_00._M_str =
               *(char **)((long)cVar5.
                                super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                ._M_cur + 0x10);
          name_00._M_len =
               *(size_t *)
                ((long)cVar5.
                       super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                       ._M_cur + 0x18);
          RangeSink::AddFileRange(sink,"wasm_data",name_00,(long)pcVar10 - (long)pcVar1,filesize);
        }
      }
      __val = __val + 1;
      pcVar10 = pcVar11;
    } while (__val != (uint)local_40);
  }
  return;
}

Assistant:

void ReadDataSection(const Section& section, const IndexedNames& names,
                     RangeSink* sink) {
  string_view data = section.contents;
  uint32_t count = ReadVarUInt32(&data);

  for (uint32_t i = 0; i < count; i++) {
    string_view segment = data;
    uint32_t mode = ReadVarUInt32(&data);
    if (mode > 1) THROW("multi-memory extension isn't supported");
    if (mode == 0) { // Active segment
      SkipInitializerExpression(&data);
    }

    uint32_t segment_size = ReadVarUInt32(&data);
    uint32_t total_size = segment_size + (data.data() - segment.data());

    segment = StrictSubstr(segment, 0, total_size);
    data = StrictSubstr(data, segment_size);

    auto iter = names.find(i);
    if (iter == names.end()) {
      std::string name = "data[" + std::to_string(i) + "]";
      sink->AddFileRange("wasm_data", name, segment);
    } else {
      sink->AddFileRange("wasm_data", iter->second, segment);
    }
  }
}